

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void btreeLeaveAll(sqlite3 *db)

{
  long in_RDI;
  Btree *p;
  int i;
  undefined4 local_c;
  
  for (local_c = 0; local_c < *(int *)(in_RDI + 0x28); local_c = local_c + 1) {
    if (*(long *)(*(long *)(in_RDI + 0x20) + (long)local_c * 0x20 + 8) != 0) {
      sqlite3BtreeLeave((Btree *)0x1589f2);
    }
  }
  return;
}

Assistant:

static void SQLITE_NOINLINE btreeLeaveAll(sqlite3 *db){
  int i;
  Btree *p;
  assert( sqlite3_mutex_held(db->mutex) );
  for(i=0; i<db->nDb; i++){
    p = db->aDb[i].pBt;
    if( p ) sqlite3BtreeLeave(p);
  }
}